

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscretePure.cpp
# Opt level: O0

JointPolicyDiscretePure * __thiscall
JointPolicyDiscretePure::operator=(JointPolicyDiscretePure *this,JointPolicyDiscretePure *o)

{
  JointPolicyDiscrete *in_RSI;
  JointPolicyDiscrete *in_RDI;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    JointPolicyDiscrete::operator=(in_RSI,in_RDI);
    local_8 = in_RDI;
  }
  return (JointPolicyDiscretePure *)local_8;
}

Assistant:

JointPolicyDiscretePure& JointPolicyDiscretePure::operator= (const JointPolicyDiscretePure& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyDiscretePure::operator=(const JointPolicyDiscretePure& jp) called"<<endl;
#endif
    if (this == &o) return *this;   // Gracefully handle self assignment
    JointPolicyDiscrete::operator= ( o );   //call parent
  // Put the normal assignment duties here...

    return *this;
}